

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeHandleMovedCursor(VdbeCursor *p)

{
  int iVar1;
  int local_14;
  int rc;
  int isDifferentRow;
  VdbeCursor *p_local;
  
  _rc = p;
  iVar1 = sqlite3BtreeCursorRestore((p->uc).pCursor,&local_14);
  _rc->cacheStatus = 0;
  if (local_14 != 0) {
    _rc->nullRow = '\x01';
  }
  return iVar1;
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeHandleMovedCursor(VdbeCursor *p){
  int isDifferentRow, rc;
  assert( p->eCurType==CURTYPE_BTREE );
  assert( p->uc.pCursor!=0 );
  assert( sqlite3BtreeCursorHasMoved(p->uc.pCursor) );
  rc = sqlite3BtreeCursorRestore(p->uc.pCursor, &isDifferentRow);
  p->cacheStatus = CACHE_STALE;
  if( isDifferentRow ) p->nullRow = 1;
  return rc;
}